

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_external_encode_store(cram_codec *c,cram_block *b,char *prefix,int version)

{
  cram_encoding cVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  byte bVar7;
  size_t __n;
  uchar *puVar5;
  ulong uVar6;
  ulong uVar8;
  size_t sVar9;
  size_t __size;
  size_t sVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  char tmp [99];
  byte local_98;
  byte local_97;
  byte local_96;
  byte local_95;
  byte local_94;
  
  if (prefix == (char *)0x0) {
    __n = 0;
  }
  else {
    __n = strlen(prefix);
    uVar6 = b->alloc;
    sVar10 = b->byte;
    if (uVar6 <= sVar10 + __n) {
      do {
        auVar11._8_4_ = (int)(uVar6 >> 0x20);
        auVar11._0_8_ = uVar6;
        auVar11._12_4_ = 0x45300000;
        dVar13 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 1.5;
        uVar8 = (ulong)dVar13;
        sVar9 = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
        if (uVar6 == 0) {
          sVar9 = 0x400;
        }
        b->alloc = sVar9;
        puVar5 = (uchar *)realloc(b->data,sVar9);
        b->data = puVar5;
        uVar6 = b->alloc;
        sVar10 = b->byte;
      } while (uVar6 <= sVar10 + __n);
    }
    memcpy(b->data + sVar10,prefix,__n);
    b->byte = b->byte + __n;
  }
  cVar1 = (c->field_6).e_byte_array_len.len_encoding;
  bVar2 = (byte)cVar1;
  if (cVar1 < 0x80) {
    sVar9 = 1;
    local_98 = bVar2;
  }
  else {
    bVar7 = (byte)(cVar1 >> 8);
    if (cVar1 < 0x4000) {
      local_98 = bVar7 | 0x80;
      sVar9 = 2;
      local_97 = bVar2;
    }
    else {
      local_97 = (byte)(cVar1 >> 0x10);
      if (cVar1 < 0x200000) {
        local_98 = local_97 | 0xc0;
        sVar9 = 3;
        local_97 = bVar7;
        local_96 = bVar2;
      }
      else {
        local_98 = (byte)(cVar1 >> 0x18);
        if (cVar1 < 0x10000000) {
          local_98 = local_98 | 0xe0;
          sVar9 = 4;
          local_96 = bVar7;
          local_95 = bVar2;
        }
        else {
          local_98 = local_98 >> 4 | 0xf0;
          local_97 = (byte)(cVar1 >> 0x14);
          local_96 = (byte)(cVar1 >> 0xc);
          local_95 = (byte)(cVar1 >> 4);
          local_94 = bVar2 & 0xf;
          sVar9 = 5;
        }
      }
    }
  }
  iVar3 = itf8_put_blk(b,c->codec);
  iVar4 = itf8_put_blk(b,(int)sVar9);
  uVar6 = b->alloc;
  sVar10 = b->byte;
  if (uVar6 <= sVar10 + sVar9) {
    do {
      auVar12._8_4_ = (int)(uVar6 >> 0x20);
      auVar12._0_8_ = uVar6;
      auVar12._12_4_ = 0x45300000;
      dVar13 = ((auVar12._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0)) * 1.5;
      uVar8 = (ulong)dVar13;
      __size = (long)(dVar13 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
      if (uVar6 == 0) {
        __size = 0x400;
      }
      b->alloc = __size;
      puVar5 = (uchar *)realloc(b->data,__size);
      b->data = puVar5;
      uVar6 = b->alloc;
      sVar10 = b->byte;
    } while (uVar6 <= sVar10 + sVar9);
  }
  memcpy(b->data + sVar10,&local_98,sVar9);
  b->byte = b->byte + sVar9;
  return iVar3 + iVar4 + (int)__n + (int)sVar9;
}

Assistant:

int cram_external_encode_store(cram_codec *c, cram_block *b, char *prefix,
			       int version) {
    char tmp[99], *tp = tmp;
    int len = 0;

    if (prefix) {
	size_t l = strlen(prefix);
	BLOCK_APPEND(b, prefix, l);
	len += l;
    }

    tp += itf8_put(tp, c->e_external.content_id);
    len += itf8_put_blk(b, c->codec);
    len += itf8_put_blk(b, tp-tmp);
    BLOCK_APPEND(b, tmp, tp-tmp);
    len += tp-tmp;

    return len;
}